

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmac.cpp
# Opt level: O0

void VHASH_PADDED_32_but_hashing(void *key,int len,uint32_t seed,void *res)

{
  int iVar1;
  undefined4 *in_RCX;
  uint in_ESI;
  void *in_RDI;
  uchar *buff;
  uchar *buffAligned;
  int bytesRemaining16aligned;
  int bytesRemaining;
  int alignedLn;
  int blcCnt;
  void *local_38;
  uchar *local_30;
  
  if (((ulong)in_RDI & 0xf) == 0) {
    if ((in_ESI & 0xf) == 0) {
      *in_RCX = 0;
    }
    else {
      iVar1 = (int)in_ESI % 0x80;
      memcpy(vhi.aligned16Buff,(void *)((long)in_RDI + (long)(((int)in_ESI / 0x80) * 0x80)),
             (long)iVar1);
      memset(vhi.aligned16Buff + iVar1,0,(long)(((iVar1 >> 4) * 0x10 + 0x10) - iVar1));
      *in_RCX = 0;
    }
  }
  else {
    local_38 = (void *)0x0;
    if ((int)in_ESI < 0x100000) {
      local_30 = vhi.aligned16Buff;
    }
    else {
      local_38 = operator_new__((long)(int)(in_ESI + 0x80));
      local_30 = (uchar *)(((ulong)local_38 & 0xfffffffffffffff0) + 0x10);
    }
    memcpy(local_30,in_RDI,(long)(int)in_ESI);
    memset(local_30 + (int)in_ESI,0,0x10);
    *in_RCX = 0;
    if ((local_38 != (void *)0x0) && (local_38 != (void *)0x0)) {
      operator_delete__(local_38);
    }
  }
  return;
}

Assistant:

void VHASH_PADDED_32_but_hashing(const void * key, int len, uint32_t seed, void * res)
{
	(void)seed; //unused
#ifdef __arm__
	if ((((uintptr_t)key) & 0xF) == 0) // aligned in memory
	{
#endif // __arm__
	if ((((uintptr_t)key) & 0xF) == 0) // aligned in memory
	{
		if (len & 0xF) // size is not a multiple of 16
		{
			int blcCnt = len / VMAC_NHBYTES;
			int alignedLn = blcCnt * VMAC_NHBYTES;
			int bytesRemaining = len - alignedLn;
			memcpy(vhi.aligned16Buff, (unsigned char*)key + alignedLn, bytesRemaining);
			int bytesRemaining16aligned = ((bytesRemaining >> 4) << 4) + 16;
			memset(vhi.aligned16Buff + bytesRemaining, 0, bytesRemaining16aligned - bytesRemaining);

			*(uint32_t*)res = 0;
		}
		else // size is a multiple of 16
		{
			*(uint32_t*)res = 0;
		}
	}
	else // unaligned data
	{
		unsigned char * buffAligned;
		unsigned char * buff = NULL;
		{
			if (len < VHASH_initializer::MAX_BUFF_LN)
				buffAligned = vhi.aligned16Buff;
			else
			{
				buff = new unsigned char[len + 128];
				buffAligned = (unsigned char*)((((size_t(buff)) >> 4) << 4) + 16);
			}
			memcpy(buffAligned, key, len);
			memset(buffAligned + len, 0, 16);
		}

		*(uint32_t*)res = 0;

		if (buff != NULL) delete[] buff;
	}
#ifdef __arm__
	}
	else // unaligned data
	{
		unsigned char * buffAligned;
		unsigned char * buff = NULL;
		{
			if ( len < VHASH_initializer::MAX_BUFF_LN )
				buffAligned = vhi.aligned16Buff;
			else
			{
				buff = new unsigned char[ len + 128 ];
				buffAligned = (unsigned char*)( ( ( ( size_t(buff) ) >> 4 ) << 4 )  + 16 );
			}
			memcpy( buffAligned, key, len );
			memset( buffAligned + len, 0, 16 );
		}
		if ( buff != NULL ) delete [] buff;
	}
#endif // __arm__
	//	vhash_abort(&(vhi.ctx));
}